

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_New_Library(FT_Memory memory,FT_Library *alibrary)

{
  FT_Library __s;
  FT_Error FVar1;
  
  FVar1 = 6;
  if (alibrary != (FT_Library *)0x0 && memory != (FT_Memory)0x0) {
    __s = (FT_Library)(*memory->alloc)(memory,0x160);
    if (__s == (FT_Library)0x0) {
      FVar1 = (uint)(__s == (FT_Library)0x0) << 6;
    }
    else {
      FVar1 = 0;
      memset(__s,0,0x160);
      __s->memory = memory;
      __s->version_major = 2;
      __s->version_minor = 9;
      __s->version_patch = 0;
      __s->refcount = 1;
      *alibrary = __s;
    }
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Library( FT_Memory    memory,
                  FT_Library  *alibrary )
  {
    FT_Library  library = NULL;
    FT_Error    error;


    if ( !memory || !alibrary )
      return FT_THROW( Invalid_Argument );

#ifdef FT_DEBUG_LEVEL_ERROR
    /* init debugging support */
    ft_debug_init();
#endif

    /* first of all, allocate the library object */
    if ( FT_NEW( library ) )
      return error;

    library->memory = memory;

#ifdef FT_CONFIG_OPTION_PIC
    /* initialize position independent code containers */
    error = ft_pic_container_init( library );
    if ( error )
      goto Fail;
#endif

    library->version_major = FREETYPE_MAJOR;
    library->version_minor = FREETYPE_MINOR;
    library->version_patch = FREETYPE_PATCH;

    library->refcount = 1;

    /* That's ok now */
    *alibrary = library;

    return FT_Err_Ok;

#ifdef FT_CONFIG_OPTION_PIC
  Fail:
    ft_pic_container_destroy( library );
    FT_FREE( library );
    return error;
#endif
  }